

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall asl::InetAddress::InetAddress(InetAddress *this,Type t)

{
  uint m;
  
  Array<unsigned_char>::Array(&this->_data);
  this->_type = t;
  m = 0;
  if (t - IPv4 < 3) {
    m = *(uint *)(&DAT_00141154 + (ulong)(t - IPv4) * 4);
  }
  Array<unsigned_char>::resize(&this->_data,m);
  memset((this->_data)._a,0,(ulong)m);
  return;
}

Assistant:

InetAddress::InetAddress(InetAddress::Type t)
{
	_type = t;
	int n = 0;
	switch (t)
	{
	case IPv4: n = sizeof(sockaddr_in); break;
	case IPv6: n = sizeof(sockaddr_in6); break;
#ifdef ASL_SOCKET_LOCAL
	case LOCAL: n = sizeof(sockaddr_un); break;
#endif
	default: ;
	}
	resize(n);
	memset(ptr(), 0, n);
}